

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

void compute_coherence_metrics<sparse_parameters>(lda *l,sparse_parameters *weights)

{
  pointer *ppfVar1;
  _Rb_tree_header *p_Var2;
  iterator __position;
  pointer pfVar3;
  pointer pwVar4;
  iterator __position_00;
  lda *plVar5;
  unsigned_long uVar6;
  pointer pwVar7;
  long lVar8;
  pointer pvVar9;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  _Var10;
  _Rb_tree_node_base *p_Var11;
  mapped_type *pmVar12;
  word_doc_frequency *wdf;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  ulong uVar15;
  long lVar16;
  _Hash_node_base *p_Var17;
  ulong uVar18;
  pointer pvVar19;
  pointer pvVar20;
  pointer puVar21;
  feature_pair *pairs;
  __node_base *p_Var22;
  vector<feature_pair,_std::allocator<feature_pair>_> *this;
  pointer pfVar23;
  ulong uVar24;
  _Rb_tree_header *p_Var25;
  __node_base *p_Var26;
  ulong uVar27;
  lda *plVar28;
  float fVar29;
  float fVar30;
  initializer_list<word_doc_frequency> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> top_features_idx;
  anon_class_1_0_00000001 cmp;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> vec;
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  coWordsDFSet;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  topics_word_pairs;
  pair<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  local_d8;
  undefined8 local_b0;
  allocator_type local_a1;
  lda *local_a0;
  pointer local_98;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> local_90;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  local_78;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  local_48;
  
  uVar15 = 1L << ((byte)l->all->num_bits & 0x3f);
  local_48.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::resize(&local_48,l->topics);
  local_a0 = l;
  if (l->topics != 0) {
    p_Var22 = &(weights->_map)._M_h._M_before_begin;
    uVar18 = 10;
    if (uVar15 < 10) {
      uVar18 = uVar15;
    }
    lVar8 = uVar18 + (uVar18 == 0);
    uVar15 = 0;
    local_b0 = p_Var22;
    do {
      local_d8.first = 0;
      local_d8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
      ::priority_queue((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                        *)&local_78,(anon_class_1_0_00000001 *)&local_98,
                       (vector<feature,_std::allocator<feature>_> *)&local_d8);
      lVar16 = lVar8;
      p_Var26 = p_Var22;
      if ((void *)local_d8.first != (void *)0x0) {
        operator_delete((void *)local_d8.first);
      }
      do {
        p_Var26 = p_Var26->_M_nxt;
        local_d8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
        _M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var26 + 1);
        local_d8.first =
             CONCAT44(local_d8.first._4_4_,
                      *(undefined4 *)
                       ((long)&(*(_Hash_node_base **)
                                 &((_Prime_rehash_policy *)(p_Var26 + 2))->_M_max_load_factor)->
                               _M_nxt + uVar15 * 4));
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                *)&local_78,(value_type *)&local_d8);
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
      for (p_Var17 = p_Var22->_M_nxt; p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt)
      {
        fVar30 = *(float *)((long)&(p_Var17[2]._M_nxt)->_M_nxt + uVar15 * 4);
        if (*(float *)local_78._M_impl._0_8_ <= fVar30 && fVar30 != *(float *)local_78._M_impl._0_8_
           ) {
          std::
          priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
          ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                 *)&local_78);
          local_d8.second.
          super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)p_Var17[1]._M_nxt;
          local_d8.first =
               CONCAT44(local_d8.first._4_4_,
                        *(undefined4 *)((long)&(p_Var17[2]._M_nxt)->_M_nxt + uVar15 * 4));
          std::
          priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
          ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                  *)&local_78,(value_type *)&local_d8);
        }
      }
      local_d8.first = 0;
      local_d8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
                 CONCAT44(local_78._M_impl.super__Rb_tree_header._M_header._4_4_,
                          local_78._M_impl.super__Rb_tree_header._M_header._M_color) -
                 local_78._M_impl._0_8_ >> 4);
      for (uVar18 = (ulong)(CONCAT44(local_78._M_impl.super__Rb_tree_header._M_header._4_4_,
                                     local_78._M_impl.super__Rb_tree_header._M_header._M_color) -
                           local_78._M_impl._0_8_) >> 4 & 0xffffffff; 0 < (int)uVar18;
          uVar18 = uVar18 - 1) {
        *(undefined8 *)(local_d8.first + uVar18 * 8 + -8) =
             *(undefined8 *)(local_78._M_impl._0_8_ + 8);
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LAIRLAB[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
               *)&local_78);
      }
      if (local_d8.second.
          super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)local_d8.first) {
        this = local_48.
               super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar15;
        uVar18 = 0;
        do {
          uVar27 = uVar18 + 1;
          uVar24 = uVar27;
          if (uVar27 < (ulong)((long)((long)local_d8.second.
                                            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                     local_d8.first) >> 3)) {
            do {
              local_90.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)((uint64_t *)local_d8.first)[uVar18];
              local_90.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((uint64_t *)local_d8.first)[uVar24];
              __position._M_current =
                   (this->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<feature_pair,_std::allocator<feature_pair>_>::
                _M_realloc_insert<feature_pair>(this,__position,(feature_pair *)&local_90);
              }
              else {
                local_90.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                     (undefined4)
                     ((ulong)local_90.
                             super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 0x20);
                local_90.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                     (undefined4)
                     ((ulong)local_90.
                             super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                             ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
                *(undefined4 *)&(__position._M_current)->f1 =
                     local_90.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_;
                *(undefined4 *)((long)&(__position._M_current)->f1 + 4) =
                     local_90.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_;
                *(undefined4 *)&(__position._M_current)->f2 =
                     local_90.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_finish._0_4_;
                *(undefined4 *)((long)&(__position._M_current)->f2 + 4) =
                     local_90.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_finish._4_4_;
                ppfVar1 = &(this->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppfVar1 = *ppfVar1 + 1;
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 < (ulong)((long)((long)local_d8.second.
                                                                                                      
                                                  super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                            local_d8.first) >> 3));
          }
          uVar18 = uVar27;
        } while (uVar27 < (ulong)((long)((long)local_d8.second.
                                               super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                               ._M_impl.super__Vector_impl_data._M_start -
                                        local_d8.first) >> 3));
      }
      if ((pointer)local_d8.first != (pointer)0x0) {
        operator_delete((void *)local_d8.first);
      }
      plVar5 = local_a0;
      p_Var22 = local_b0;
      if ((float *)local_78._M_impl._0_8_ != (float *)0x0) {
        operator_delete((void *)local_78._M_impl._0_8_);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < plVar5->topics);
  }
  p_Var2 = &local_78._M_impl.super__Rb_tree_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = (__node_base *)
             local_48.
             super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  plVar5 = local_a0;
  p_Var11 = &p_Var2->_M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (local_48.
      super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar9 = local_48.
             super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pfVar3 = (pvVar9->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pfVar23 = (pvVar9->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>).
                     _M_impl.super__Vector_impl_data._M_start; pfVar23 != pfVar3;
          pfVar23 = pfVar23 + 1) {
        pwVar4 = (pointer)pfVar23->f1;
        local_98 = (pointer)pfVar23->f2;
        p_Var13 = &p_Var2->_M_header;
        for (p_Var14 = local_78._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var14 != (_Rb_tree_header *)0x0;
            p_Var14 = (&p_Var14->_M_left)[*(pointer *)(p_Var14 + 1) < pwVar4]) {
          if (*(pointer *)(p_Var14 + 1) >= pwVar4) {
            p_Var13 = p_Var14;
          }
        }
        p_Var25 = p_Var2;
        if (((_Rb_tree_header *)p_Var13 != p_Var2) &&
           (p_Var25 = (_Rb_tree_header *)p_Var13,
           pwVar4 < (pointer)((_Rb_tree_header *)p_Var13)->_M_node_count)) {
          p_Var25 = p_Var2;
        }
        if (p_Var25 == p_Var2) {
          local_d8.second.
          super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((ulong)local_d8.second.
                                super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          __l._M_len = 1;
          __l._M_array = (iterator)&local_d8;
          local_d8.first = (unsigned_long)local_98;
          std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::vector
                    (&local_90,__l,&local_a1);
          local_d8.first = (unsigned_long)pwVar4;
          std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::vector
                    (&local_d8.second,&local_90);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_long,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>>
                      *)&local_78,&local_d8);
          if (local_d8.second.
              super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.second.
                            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_90.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.
                            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          _Var10 = std::
                   __find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,__gnu_cxx::__ops::_Iter_pred<compute_coherence_metrics<sparse_parameters>(lda&,sparse_parameters&)::_lambda(word_doc_frequency_const&)_1_>>
                             (*(undefined8 *)(p_Var25 + 1),*(undefined8 *)((long)(p_Var25 + 1) + 8),
                              &local_98);
          pwVar4 = local_d8.second.
                   super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          __position_00._M_current = *(word_doc_frequency **)((long)(p_Var25 + 1) + 8);
          if (_Var10._M_current != __position_00._M_current) {
            local_d8.first = (unsigned_long)local_98;
            uVar6 = local_d8.first;
            local_d8.second.
            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_d8.second.
                                  super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            pwVar7 = local_d8.second.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (__position_00._M_current == *(word_doc_frequency **)((long)(p_Var25 + 1) + 0x10)) {
              std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::
              _M_realloc_insert<word_doc_frequency>
                        ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                         (p_Var25 + 1),__position_00,(word_doc_frequency *)&local_d8);
            }
            else {
              local_d8.first._0_4_ = SUB84(local_98,0);
              local_d8.first._4_4_ = (undefined4)((ulong)local_98 >> 0x20);
              local_d8.second.
              super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = SUB84(pwVar4,4);
              *(undefined4 *)&(__position_00._M_current)->idx = (undefined4)local_d8.first;
              *(undefined4 *)((long)&(__position_00._M_current)->idx + 4) = local_d8.first._4_4_;
              (__position_00._M_current)->count = 0;
              *(undefined4 *)&(__position_00._M_current)->field_0xc =
                   local_d8.second.
                   super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_;
              *(long *)((long)(p_Var25 + 1) + 8) = *(long *)((long)(p_Var25 + 1) + 8) + 0x10;
              local_d8.first = uVar6;
              local_d8.second.
              super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
              super__Vector_impl_data._M_start = pwVar7;
            }
          }
        }
      }
      pvVar9 = pvVar9 + 1;
      plVar5 = local_a0;
      p_Var11 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (pvVar9 != (pointer)local_b0);
  }
  do {
    plVar28 = local_a0;
    if ((_Rb_tree_header *)p_Var11 == p_Var2) {
      local_b0._4_4_ = (uint)((ulong)local_b0 >> 0x20);
      if (local_a0->topics == 0) {
        local_b0 = (__node_base *)((ulong)local_b0._4_4_ << 0x20);
        uVar15 = 0;
        local_a0 = plVar5;
      }
      else {
        local_b0 = (__node_base *)((ulong)local_b0._4_4_ << 0x20);
        uVar18 = 0;
        local_a0 = plVar5;
        do {
          pfVar23 = local_48.
                    super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar18].
                    super__Vector_base<feature_pair,_std::allocator<feature_pair>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pfVar3 = local_48.
                   super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].
                   super__Vector_base<feature_pair,_std::allocator<feature_pair>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          fVar30 = 0.0;
          if (pfVar23 != pfVar3) {
            fVar30 = 0.0;
            do {
              local_d8.first = pfVar23->f1;
              if ((plVar28->feature_counts).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_d8.first] != 0) {
                local_90.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pfVar23->f2;
                pmVar12 = std::
                          map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                          ::operator[]((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                                        *)&local_78,&local_d8.first);
                _Var10 = std::
                         __find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,__gnu_cxx::__ops::_Iter_pred<compute_coherence_metrics<sparse_parameters>(lda&,sparse_parameters&)::_lambda(word_doc_frequency_const&)_2_>>
                                   ((pmVar12->
                                    super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                                    (pmVar12->
                                    super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                    )._M_impl.super__Vector_impl_data._M_finish,&local_90);
                plVar28 = local_a0;
                if (_Var10._M_current !=
                    (pmVar12->
                    super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
                  fVar29 = logf(((float)(_Var10._M_current)->count + 1e-06) /
                                (float)(local_a0->feature_counts).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[local_d8.first]);
                  fVar30 = fVar30 + fVar29;
                }
              }
              pfVar23 = pfVar23 + 1;
            } while (pfVar23 != pfVar3);
          }
          printf("Topic %3d coherence: %f\n",SUB84((double)fVar30,0),uVar18 & 0xffffffff);
          local_b0 = (__node_base *)CONCAT44(local_b0._4_4_,(float)local_b0 + fVar30);
          uVar18 = uVar18 + 1;
          uVar15 = plVar28->topics;
        } while (uVar18 < uVar15);
      }
      printf("Avg topic coherence: %f\n",SUB84((double)((float)local_b0 / (float)uVar15),0));
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
      ::~_Rb_tree(&local_78);
      std::
      vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
      ::~vector(&local_48);
      return;
    }
    p_Var14 = p_Var11[1]._M_parent;
    p_Var13 = p_Var11[1]._M_left;
    if (p_Var14 != p_Var13) {
      pvVar19 = (local_a0->feature_to_example_map).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + *(long *)(p_Var11 + 1);
      do {
        puVar21 = (pvVar19->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&(pvVar19->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data + 8) != puVar21) {
          pvVar20 = (local_a0->feature_to_example_map).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var14;
          uVar15 = 0;
          uVar18 = 0;
          do {
            lVar8 = *(long *)&(pvVar20->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data;
            if ((ulong)((long)*(pointer *)
                               ((long)&(pvVar20->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data + 8) - lVar8 >> 3) <=
                uVar15) break;
            uVar24 = *(ulong *)(lVar8 + uVar15 * 8);
            if (puVar21[uVar18] == uVar24) {
              *(int *)&p_Var14->_M_parent = *(int *)&p_Var14->_M_parent + 1;
              uVar18 = uVar18 + 1;
LAB_001ab6a1:
              uVar15 = uVar15 + 1;
            }
            else {
              if (uVar24 < puVar21[uVar18]) goto LAB_001ab6a1;
              uVar18 = uVar18 + 1;
            }
            puVar21 = (pvVar19->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar18 < (ulong)((long)*(pointer *)
                                           ((long)&(pvVar19->
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                    (long)puVar21 >> 3));
        }
        p_Var14 = (_Base_ptr)&p_Var14->_M_left;
      } while (p_Var14 != p_Var13);
    }
    local_a0 = plVar5;
    p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    plVar5 = local_a0;
    local_a0 = plVar28;
  } while( true );
}

Assistant:

void compute_coherence_metrics(lda &l, T &weights)
{
  uint64_t length = (uint64_t)1 << l.all->num_bits;

  std::vector<std::vector<feature_pair>> topics_word_pairs;
  topics_word_pairs.resize(l.topics);

  int top_words_count = 10;  // parameterize and check

  for (size_t topic = 0; topic < l.topics; topic++)
  {
    // get top features for this topic
    auto cmp = [](feature &left, feature &right) { return left.x > right.x; };
    std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
    typename T::iterator iter = weights.begin();
    for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
      top_features.push(feature((&(*iter))[topic], iter.index()));

    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if ((&(*v))[topic] > top_features.top().x)
      {
        top_features.pop();
        top_features.push(feature((&(*v))[topic], v.index()));
      }

    // extract idx and sort descending
    vector<uint64_t> top_features_idx;
    top_features_idx.resize(top_features.size());
    for (int i = (int)top_features.size() - 1; i >= 0; i--)
    {
      top_features_idx[i] = top_features.top().weight_index;
      top_features.pop();
    }

    auto &word_pairs = topics_word_pairs[topic];
    for (size_t i = 0; i < top_features_idx.size(); i++)
      for (size_t j = i + 1; j < top_features_idx.size(); j++)
        word_pairs.push_back(feature_pair(top_features_idx[i], top_features_idx[j]));
  }

  // compress word pairs and create record for storing frequency
  std::map<uint64_t, std::vector<word_doc_frequency>> coWordsDFSet;
  for (auto &vec : topics_word_pairs)
  {
    for (auto &wp : vec)
    {
      auto f1 = wp.f1;
      auto f2 = wp.f2;
      auto wdf = coWordsDFSet.find(f1);

      if (wdf != coWordsDFSet.end())
      {
        // http://stackoverflow.com/questions/5377434/does-stdmapiterator-return-a-copy-of-value-or-a-value-itself
        // if (wdf->second.find(f2) == wdf->second.end())

        if (std::find_if(wdf->second.begin(), wdf->second.end(),
                [&f2](const word_doc_frequency &v) { return v.idx == f2; }) != wdf->second.end())
        {
          wdf->second.push_back({f2, 0});
          // printf(" add %d %d\n", f1, f2);
        }
      }
      else
      {
        std::vector<word_doc_frequency> vec = {{f2, 0}};
        coWordsDFSet.insert(std::make_pair(f1, vec));
        // printf(" insert %d %d\n", f1, f2);
      }
    }
  }

  // this.GetWordPairsDocumentFrequency(coWordsDFSet);
  for (auto &pair : coWordsDFSet)
  {
    auto &examples_for_f1 = l.feature_to_example_map[pair.first];
    for (auto &wdf : pair.second)
    {
      auto &examples_for_f2 = l.feature_to_example_map[wdf.idx];

      // assumes examples_for_f1 and examples_for_f2 are orderd
      size_t i = 0;
      size_t j = 0;
      while (i < examples_for_f1.size() && j < examples_for_f2.size())
      {
        if (examples_for_f1[i] == examples_for_f2[j])
        {
          wdf.count++;
          i++;
          j++;
        }
        else if (examples_for_f2[j] < examples_for_f1[i])
          j++;
        else
          i++;
      }
    }
  }

  float epsilon = 1e-6f;  // TODO
  float avg_coherence = 0;
  for (size_t topic = 0; topic < l.topics; topic++)
  {
    float coherence = 0;

    for (auto &pairs : topics_word_pairs[topic])
    {
      auto f1 = pairs.f1;
      if (l.feature_counts[f1] == 0)
        continue;

      auto f2 = pairs.f2;
      auto &co_feature = coWordsDFSet[f1];
      auto co_feature_df = std::find_if(
          co_feature.begin(), co_feature.end(), [&f2](const word_doc_frequency &v) { return v.idx == f2; });

      if (co_feature_df != co_feature.end())
      {
        // printf("(%d:%d + eps)/(%d:%d)\n", f2, co_feature_df->count, f1, l.feature_counts[f1]);
        coherence += logf((co_feature_df->count + epsilon) / l.feature_counts[f1]);
      }
    }

    printf("Topic %3d coherence: %f\n", (int)topic, coherence);

    // TODO: expose per topic coherence

    // TODO: good vs. bad topics
    avg_coherence += coherence;
  }

  avg_coherence /= l.topics;

  printf("Avg topic coherence: %f\n", avg_coherence);
}